

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int nodeRelease(Rtree *pRtree,RtreeNode *pNode)

{
  int *piVar1;
  int iVar2;
  
  if (pNode == (RtreeNode *)0x0) {
    return 0;
  }
  piVar1 = &pNode->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    pRtree->nNodeRef = pRtree->nNodeRef - 1;
    if (pNode->iNode == 1) {
      pRtree->iDepth = -1;
    }
    if ((pNode->pParent == (RtreeNode *)0x0) ||
       (iVar2 = nodeRelease(pRtree,pNode->pParent), iVar2 == 0)) {
      iVar2 = nodeWrite(pRtree,pNode);
    }
    nodeHashDelete(pRtree,pNode);
    sqlite3_free(pNode);
    return iVar2;
  }
  return 0;
}

Assistant:

static int nodeRelease(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode ){
    assert( pNode->nRef>0 );
    assert( pRtree->nNodeRef>0 );
    pNode->nRef--;
    if( pNode->nRef==0 ){
      pRtree->nNodeRef--;
      if( pNode->iNode==1 ){
        pRtree->iDepth = -1;
      }
      if( pNode->pParent ){
        rc = nodeRelease(pRtree, pNode->pParent);
      }
      if( rc==SQLITE_OK ){
        rc = nodeWrite(pRtree, pNode);
      }
      nodeHashDelete(pRtree, pNode);
      sqlite3_free(pNode);
    }
  }
  return rc;
}